

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileDescriptorProto::SharedDtor(FileDescriptorProto *this)

{
  ulong uVar1;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x624);
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  if ((undefined8 *)(this->name_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->name_);
  }
  if ((undefined8 *)(this->package_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->package_);
  }
  if ((undefined8 *)(this->syntax_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->syntax_);
  }
  if (this != (FileDescriptorProto *)_FileDescriptorProto_default_instance_) {
    this_00 = this->options_;
    if (this_00 != (FileOptions *)0x0) {
      FileOptions::~FileOptions(this_00);
    }
    operator_delete(this_00);
    this_01 = this->source_code_info_;
    if (this_01 != (SourceCodeInfo *)0x0) {
      SourceCodeInfo::~SourceCodeInfo(this_01);
    }
    operator_delete(this_01);
  }
  return;
}

Assistant:

inline void FileDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  package_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  syntax_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
  if (this != internal_default_instance()) delete source_code_info_;
}